

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddUtxoTemplateForFundRawTx
              (void *handle,void *fund_handle,char *txid,uint32_t vout,int64_t amount,
              char *descriptor,char *asset,char *scriptsig_template)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_5b1;
  string local_5b0;
  undefined1 local_590 [8];
  int local_588;
  char *local_580;
  UtxoData utxo;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&utxo,"FundRawTxData",(allocator *)local_590);
  cfd::capi::CheckBuffer(fund_handle,(string *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    utxo.block_height =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
         + 0x67;
    utxo.block_hash._vptr_BlockHash._0_4_ = 0xc1e;
    utxo.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "CfdAddUtxoTemplateForFundRawTx";
    cfd::core::logger::warn<>((CfdSourceLocation *)&utxo,"txid is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&utxo,"Failed to parameter. txid is null or empty.",(allocator *)local_590)
    ;
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&utxo);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(descriptor);
  if (!bVar1) {
    cfd::UtxoData::UtxoData(&utxo);
    utxo.address_type = kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = (void *)0x0;
    std::__cxx11::string::string((string *)&local_5b0,txid,&local_5b1);
    cfd::core::Txid::Txid((Txid *)local_590,&local_5b0);
    cfd::core::Txid::operator=(&utxo.txid,(Txid *)local_590);
    cfd::core::Txid::~Txid((Txid *)local_590);
    std::__cxx11::string::~string((string *)&local_5b0);
    utxo.vout = vout;
    cfd::core::Amount::Amount((Amount *)local_590,amount);
    utxo.amount.ignore_check_ = local_588._0_1_;
    utxo.amount.amount_ = (int64_t)local_590;
    std::__cxx11::string::string((string *)local_590,descriptor,(allocator *)&local_5b0);
    std::__cxx11::string::operator=((string *)&utxo.descriptor,(string *)local_590);
    std::__cxx11::string::~string((string *)local_590);
    utxo.address_type = kP2shAddress;
    bVar1 = cfd::capi::IsEmptyString(scriptsig_template);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_5b0,scriptsig_template,&local_5b1);
      cfd::core::Script::Script((Script *)local_590,&local_5b0);
      cfd::core::Script::operator=(&utxo.scriptsig_template,(Script *)local_590);
      cfd::core::Script::~Script((Script *)local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
    }
    if (*(char *)((long)fund_handle + 0x35) == '\x01') {
      bVar1 = cfd::capi::IsEmptyString(asset);
      if (bVar1) {
        local_590 = (undefined1  [8])0x5277c7;
        local_588 = 0xc3b;
        local_580 = "CfdAddUtxoTemplateForFundRawTx";
        cfd::core::logger::warn<>((CfdSourceLocation *)local_590,"utxo asset is null or empty.");
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_590,"Failed to parameter. utxo asset is null or empty.",
                   (allocator *)&local_5b0);
        cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_590);
        __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::__cxx11::string::string((string *)&local_5b0,asset,&local_5b1);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_590,&local_5b0);
      cfd::core::ConfidentialAssetId::operator=(&utxo.asset,(ConfidentialAssetId *)local_590);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
    }
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
              (*(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> **)((long)fund_handle + 0x38)
               ,&utxo);
    cfd::UtxoData::~UtxoData(&utxo);
    return 0;
  }
  utxo.block_height =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_transaction.cpp"
       + 0x67;
  utxo.block_hash._vptr_BlockHash._0_4_ = 0xc24;
  utxo.block_hash.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "CfdAddUtxoTemplateForFundRawTx";
  cfd::core::logger::warn<>((CfdSourceLocation *)&utxo,"descriptor is null or empty.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&utxo,"Failed to parameter. descriptor is null or empty.",
             (allocator *)local_590);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&utxo);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddUtxoTemplateForFundRawTx(
    void* handle, void* fund_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* descriptor, const char* asset,
    const char* scriptsig_template) {
  try {
    cfd::Initialize();
    CheckBuffer(fund_handle, kPrefixFundRawTxData);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(descriptor)) {
      warn(CFD_LOG_SOURCE, "descriptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. descriptor is null or empty.");
    }
    CfdCapiFundRawTxData* buffer =
        static_cast<CfdCapiFundRawTxData*>(fund_handle);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.txid = Txid(txid);
    utxo.vout = vout;
    utxo.amount = Amount(amount);
    utxo.descriptor = std::string(descriptor);
    utxo.address_type = AddressType::kP2shAddress;  // force init
    if (!IsEmptyString(scriptsig_template)) {
      utxo.scriptsig_template = Script(std::string(scriptsig_template));
    }
    if (buffer->is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
      if (IsEmptyString(asset)) {
        warn(CFD_LOG_SOURCE, "utxo asset is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. utxo asset is null or empty.");
      }
      utxo.asset = ConfidentialAssetId(asset);
#endif  // CFD_DISABLE_ELEMENTS
    }
    buffer->utxos->push_back(utxo);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}